

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlitePagerRegisterKvEngine(Pager *pPager,unqlite_kv_methods *pMethods)

{
  sxu32 nByte;
  unqlite *pDb;
  int iVar1;
  unqlite_kv_engine *pChunk;
  unqlite_kv_io *pSrc;
  
  pDb = pPager->pDb;
  if (pPager->pEngine == (unqlite_kv_engine *)0x0) {
LAB_001144fe:
    nByte = pMethods->szKv;
    pChunk = (unqlite_kv_engine *)SyMemBackendAlloc(&pDb->sMem,nByte);
    if (pChunk != (unqlite_kv_engine *)0x0) {
      pSrc = (unqlite_kv_io *)SyMemBackendAlloc(&pDb->sMem,0x88);
      if (pSrc != (unqlite_kv_io *)0x0) {
        SyZero(pSrc,0x58);
        SyZero(pChunk,nByte);
        pSrc->pHandle = pPager;
        pSrc->pMethods = pMethods;
        pSrc->xGet = unqliteKvIoPageGet;
        pSrc->xLookup = unqliteKvIoPageLookup;
        pSrc->xNew = unqliteKvIoNewPage;
        pSrc->xWrite = unqliteKvIopageWrite;
        pSrc->xDontWrite = unqliteKvIoPageDontWrite;
        pSrc->xDontJournal = unqliteKvIoPageDontJournal;
        pSrc->xDontMkHot = unqliteKvIoPageDontMakeHot;
        pSrc->xPageRef = unqliteKvIopage_ref;
        pSrc->xPageUnref = unqliteKvIoPageUnRef;
        pSrc->xPageSize = unqliteKvIoPageSize;
        pSrc->xReadOnly = unqliteKvIoReadOnly;
        pSrc->xTmpPage = unqliteKvIoTempPage;
        pSrc->xSetUnpin = unqliteKvIoPageUnpin;
        pSrc->xSetReload = unqliteKvIoPageReload;
        pSrc->xErr = unqliteKvIoErr;
        pChunk->pIo = pSrc;
        if (pMethods->xInit != (_func_int_unqlite_kv_engine_ptr_int *)0x0) {
          iVar1 = 0x1000;
          if (0xffff01fe < sUnqlMPGlobal.iPageSize - 0x10001U) {
            iVar1 = sUnqlMPGlobal.iPageSize;
          }
          iVar1 = (*pMethods->xInit)(pChunk,iVar1);
          if (iVar1 != 0) {
            unqliteGenErrorFormat
                      (pDb,"xInit() method of the underlying KV engine \'%z\' failed",&pPager->sKv);
            goto LAB_00114688;
          }
          pChunk->pIo = pSrc;
        }
        pPager->pEngine = pChunk;
        iVar1 = unqliteInitCursor(pDb,&(pDb->sDB).pCursor);
        if (iVar1 != 0) {
LAB_00114688:
          SyMemBackendFree(&pDb->sMem,pChunk);
          SyMemBackendFree(&pDb->sMem,pSrc);
          return iVar1;
        }
        goto LAB_001146a0;
      }
      SyMemBackendFree(&pDb->sMem,pChunk);
    }
    unqliteGenOutofMem(pDb);
    iVar1 = -1;
  }
  else {
    if (pPager->pEngine->pIo->pMethods != pMethods) {
      pager_release_kv_engine(pPager);
      goto LAB_001144fe;
    }
LAB_001146a0:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerRegisterKvEngine(Pager *pPager,unqlite_kv_methods *pMethods)
{
	unqlite_db *pStorage = &pPager->pDb->sDB;
	unqlite *pDb = pPager->pDb;
	unqlite_kv_engine *pEngine;
	unqlite_kv_io *pIo;
	sxu32 nByte;
	int rc;
	if( pPager->pEngine ){
		if( pMethods == pPager->pEngine->pIo->pMethods ){
			/* Ticket 1432: Same implementation */
			return UNQLITE_OK;
		}
		/* Release the old KV engine */
		pager_release_kv_engine(pPager);
	}
	/* Allocate a new KV engine instance */
	nByte = (sxu32)pMethods->szKv;
	pEngine = (unqlite_kv_engine *)SyMemBackendAlloc(&pDb->sMem,nByte);
	if( pEngine == 0 ){
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	pIo = (unqlite_kv_io *)SyMemBackendAlloc(&pDb->sMem,sizeof(unqlite_kv_io));
	if( pIo == 0 ){
		SyMemBackendFree(&pDb->sMem,pEngine);
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pIo,sizeof(unqlite_io_methods));
	SyZero(pEngine,nByte);
	/* Populate the IO structure */
	pager_kv_io_init(pPager,pMethods,pIo);
	pEngine->pIo = pIo;
	/* Invoke the init callback if avaialble */
	if( pMethods->xInit ){
		rc = pMethods->xInit(pEngine,unqliteGetPageSize());
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pDb,
				"xInit() method of the underlying KV engine '%z' failed",&pPager->sKv);
			goto fail;
		}
		pEngine->pIo = pIo;
	}
	pPager->pEngine = pEngine;
	/* Allocate a new cursor */
	rc = unqliteInitCursor(pDb,&pStorage->pCursor);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	return UNQLITE_OK;
fail:
	SyMemBackendFree(&pDb->sMem,pEngine);
	SyMemBackendFree(&pDb->sMem,pIo);
	return rc;
}